

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::MetalMaterial::MetalMaterial(MetalMaterial *this,Vec3fa *reflectance,Vec3fa *eta,Vec3fa *k)

{
  size_type sVar1;
  undefined8 *in_RCX;
  size_type *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  allocator *this_00;
  allocator local_71;
  string local_70 [32];
  undefined8 *local_50;
  size_type *local_48;
  undefined8 *local_40;
  
  this_00 = &local_71;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",this_00);
  SceneGraph::MaterialNode::MaterialNode((MaterialNode *)this_00,in_RDI);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  *(undefined ***)in_RDI = &PTR__MetalMaterial_005efd10;
  Material::Material((Material *)&in_RDI[3].field_2,MATERIAL_REFLECTIVE_METAL);
  sVar1 = local_40[1];
  *(undefined8 *)(in_RDI + 4) = *local_40;
  in_RDI[4]._M_string_length = sVar1;
  sVar1 = local_48[1];
  in_RDI[4].field_2._M_allocated_capacity = *local_48;
  *(size_type *)((long)&in_RDI[4].field_2 + 8) = sVar1;
  sVar1 = local_50[1];
  *(undefined8 *)(in_RDI + 5) = *local_50;
  in_RDI[5]._M_string_length = sVar1;
  *(undefined4 *)&in_RDI[5].field_2 = 0;
  return;
}

Assistant:

MetalMaterial (const Vec3fa& reflectance, const Vec3fa& eta, const Vec3fa& k)
      : base(MATERIAL_REFLECTIVE_METAL), reflectance(reflectance), eta(eta), k(k), roughness(0.0f) {}